

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_variables(CompilerHLSL *this)

{
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var1;
  uint uVar2;
  size_t sVar3;
  Variant *pVVar4;
  TypedID<(spirv_cross::Types)3> *pTVar5;
  Bitset *pBVar6;
  undefined8 uVar7;
  bool bVar8;
  StorageClass SVar9;
  uint32_t uVar10;
  SPIRVariable *var;
  SPIRType *pSVar11;
  mapped_type *pmVar12;
  StorageClass SVar13;
  Variant *ts_1;
  TypedID<(spirv_cross::Types)0> *id;
  _Hash_node_base *p_Var14;
  TypedID<(spirv_cross::Types)0> *pTVar15;
  __hashtable *__h;
  ulong uVar16;
  __node_base _Var17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  BaseType sample_mask_out_basetype;
  BaseType sample_mask_in_basetype;
  __alloc_node_gen_t __alloc_node_gen;
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
  builtin_to_initializer;
  Bitset builtins;
  BaseType local_120;
  BaseType local_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [48];
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  ulong local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_70 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count =
       (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h._M_bucket_count;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ts_1 = (Variant *)
         (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
         _M_element_count;
  pBVar6 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins;
  local_68._M_rehash_policy._M_max_load_factor =
       (pBVar6->higher)._M_h._M_rehash_policy._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ = *(undefined4 *)&(pBVar6->higher)._M_h._M_rehash_policy.field_0x4
  ;
  local_68._M_rehash_policy._M_next_resize =
       (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h._M_rehash_policy.
       _M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_118._0_8_ = &local_68;
  local_68._M_element_count = (size_type)ts_1;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_68,
             &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> *)
             local_118);
  local_70 = local_70 | (this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower;
  p_Var14 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
            _M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    do {
      local_118._0_8_ = &local_68;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_68,p_Var14 + 1,local_118);
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  local_a8._M_buckets = &local_a8._M_single_bucket;
  local_a8._M_bucket_count = 1;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_11c = Void;
  local_120 = Void;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar15 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_c8._24_8_ = pTVar15 + sVar3;
    do {
      uVar16 = (ulong)pTVar15->id;
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      ts_1 = (Variant *)(uVar16 * 3);
      if (pVVar4[uVar16].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar16);
        bVar8 = Compiler::is_builtin_variable((Compiler *)this,var);
        if (bVar8) {
          pSVar11 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(var->super_IVariant).field_0xc);
          SVar9 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
          SVar13 = SVar9 ^ 0x14;
          ts_1 = (Variant *)(ulong)SVar13;
          if (var->storage == Input && SVar13 == StorageClassUniformConstant) {
            local_11c = pSVar11->basetype;
          }
          else {
            SVar13 = SVar13 | var->storage ^ Output;
            ts_1 = (Variant *)(ulong)SVar13;
            if (SVar13 == StorageClassUniformConstant) {
              local_120 = pSVar11->basetype;
            }
          }
          uVar16 = (ulong)(var->initializer).id;
          if ((uVar16 != 0) && (var->storage == Output)) {
            if ((uVar16 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.buffer_size) &&
               (ts_1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr, ts_1[uVar16].type == TypeConstant
               )) {
              local_c8._16_8_ = Variant::get<spirv_cross::SPIRConstant>(ts_1 + uVar16);
            }
            else {
              local_c8._16_8_ = (SPIRConstant *)0x0;
            }
            if ((SPIRConstant *)local_c8._16_8_ != (SPIRConstant *)0x0) {
              if (pSVar11->basetype == Struct) {
                uVar16 = (ulong)(uint)(pSVar11->member_types).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                      .buffer_size;
                if (uVar16 != 0) {
                  uVar20 = 0;
                  do {
                    ts_1 = (Variant *)0xb;
                    bVar8 = Compiler::has_member_decoration
                                      ((Compiler *)this,(TypeID)(pSVar11->super_IVariant).self.id,
                                       (uint32_t)uVar20,BuiltIn);
                    if (bVar8) {
                      pTVar5 = (((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)
                                (local_c8._16_8_ + 0x110))->
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
                      uVar10 = Compiler::get_member_decoration
                                         ((Compiler *)this,(TypeID)(pSVar11->super_IVariant).self.id
                                          ,(uint32_t)uVar20,BuiltIn);
                      local_d8._0_4_ = uVar10;
                      pmVar12 = ::std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)&local_a8,(key_type *)local_d8);
                      uVar2 = pTVar5[uVar20].id;
                      ts_1 = (Variant *)(ulong)uVar2;
                      pmVar12->id = uVar2;
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar16 != uVar20);
                }
              }
              else {
                bVar8 = Compiler::has_decoration
                                  ((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
                if (bVar8) {
                  local_d8._0_4_ = SVar9;
                  pmVar12 = ::std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_a8,(key_type *)local_d8);
                  uVar2 = (var->initializer).id;
                  ts_1 = (Variant *)(ulong)uVar2;
                  pmVar12->id = uVar2;
                }
              }
            }
          }
        }
      }
      pTVar15 = pTVar15 + 1;
    } while (pTVar15 != (TypedID<(spirv_cross::Types)0> *)local_c8._24_8_);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_118);
  local_d8._0_8_ = &local_a8;
  local_c8._0_8_ = &local_11c;
  local_c8._8_8_ = &local_120;
  uVar16 = 0;
  local_d8._8_8_ = this;
  do {
    if ((local_70 >> (uVar16 & 0x3f) & 1) != 0) {
      emit_builtin_variables::anon_class_32_4_fdb8fe48::operator()
                ((anon_class_32_4_fdb8fe48 *)local_d8,(uint32_t)uVar16);
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x40);
  if ((Variant *)local_68._M_element_count != (Variant *)0x0) {
    local_118._8_8_ = (Variant *)0x0;
    local_108._0_8_ = (__buckets_ptr)0x8;
    local_118._0_8_ =
         (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          *)(local_108 + 8);
    SmallVector<unsigned_int,_8UL>::reserve
              ((SmallVector<unsigned_int,_8UL> *)local_118,local_68._M_element_count);
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var17._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        SmallVector<unsigned_int,_8UL>::reserve
                  ((SmallVector<unsigned_int,_8UL> *)local_118,
                   (size_t)((long)(ObjectPoolGroup **)local_118._8_8_ + 1));
        *(undefined4 *)(local_118._0_8_ + local_118._8_8_ * 4) =
             *(undefined4 *)&_Var17._M_nxt[1]._M_nxt;
        ts_1 = (Variant *)((long)(ObjectPoolGroup **)local_118._8_8_ + 1);
        _Var17._M_nxt = (_Var17._M_nxt)->_M_nxt;
        local_118._8_8_ = ts_1;
      } while (_Var17._M_nxt != (_Hash_node_base *)0x0);
    }
    uVar7 = local_118._0_8_;
    if ((Variant *)local_118._8_8_ != (Variant *)0x0) {
      p_Var1 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)(local_118._0_8_ + local_118._8_8_ * 4);
      lVar18 = 0x3f;
      if ((Variant *)local_118._8_8_ != (Variant *)0x0) {
        for (; (ulong)local_118._8_8_ >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_118._0_8_,p_Var1,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(uVar7,p_Var1);
    }
    uVar7 = local_118._0_8_;
    if ((Variant *)local_118._8_8_ != (Variant *)0x0) {
      lVar18 = local_118._8_8_ << 2;
      lVar19 = 0;
      do {
        emit_builtin_variables::anon_class_32_4_fdb8fe48::operator()
                  ((anon_class_32_4_fdb8fe48 *)local_d8,*(uint32_t *)(uVar7 + lVar19));
        lVar19 = lVar19 + 4;
      } while (lVar18 != lVar19);
    }
    local_118._8_8_ = 0;
    if ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
         *)local_118._0_8_ !=
        (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
         *)(local_108 + 8)) {
      free((void *)local_118._0_8_);
    }
  }
  if (((this->base_vertex_info).used == true) && ((this->hlsl_options).shader_model < 0x44)) {
    local_118._8_8_ = 0;
    local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
    local_118._0_8_ =
         (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          *)local_108;
    if ((this->base_vertex_info).explicit_binding == true) {
      join<char_const(&)[14],unsigned_int&>
                ((string *)local_d8,(spirv_cross *)" : register(b",
                 (char (*) [14])&this->base_vertex_info,(uint *)ts_1);
      ::std::__cxx11::string::operator=((string *)local_118,(string *)local_d8);
      if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_d8._0_8_ !=
          (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_c8) {
        operator_delete((void *)local_d8._0_8_);
      }
      if ((this->base_vertex_info).register_space != 0) {
        join<char_const(&)[8],unsigned_int&>
                  ((string *)local_d8,(spirv_cross *)", space",
                   (char (*) [8])&(this->base_vertex_info).register_space,(uint *)ts_1);
        ::std::__cxx11::string::_M_append(local_118,local_d8._0_8_);
        if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)local_d8._0_8_ !=
            (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)local_c8) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
      ::std::__cxx11::string::append(local_118);
    }
    CompilerGLSL::statement<char_const(&)[31],std::__cxx11::string&>
              (&this->super_CompilerGLSL,(char (*) [31])"cbuffer SPIRV_Cross_VertexInfo",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[28]>(&this->super_CompilerGLSL,(char (*) [28])0x416781);
    CompilerGLSL::statement<char_const(&)[30]>(&this->super_CompilerGLSL,(char (*) [30])0x41672b);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x3edd35);
    if ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
         *)local_118._0_8_ !=
        (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
         *)local_108) {
      operator_delete((void *)local_118._0_8_);
    }
  }
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a8);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_variables()
{
	Bitset builtins = active_input_builtins;
	builtins.merge_or(active_output_builtins);

	std::unordered_map<uint32_t, ID> builtin_to_initializer;

	// We need to declare sample mask with the same type that module declares it.
	// Sample mask is somewhat special in that SPIR-V has an array, and we can copy that array, so we need to
	// match sign.
	SPIRType::BaseType sample_mask_in_basetype = SPIRType::Void;
	SPIRType::BaseType sample_mask_out_basetype = SPIRType::Void;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (!is_builtin_variable(var))
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

		if (var.storage == StorageClassInput && builtin == BuiltInSampleMask)
			sample_mask_in_basetype = type.basetype;
		else if (var.storage == StorageClassOutput && builtin == BuiltInSampleMask)
			sample_mask_out_basetype = type.basetype;

		if (var.initializer && var.storage == StorageClassOutput)
		{
			auto *c = this->maybe_get<SPIRConstant>(var.initializer);
			if (!c)
				return;

			if (type.basetype == SPIRType::Struct)
			{
				uint32_t member_count = uint32_t(type.member_types.size());
				for (uint32_t i = 0; i < member_count; i++)
				{
					if (has_member_decoration(type.self, i, DecorationBuiltIn))
					{
						builtin_to_initializer[get_member_decoration(type.self, i, DecorationBuiltIn)] =
								c->subconstants[i];
					}
				}
			}
			else if (has_decoration(var.self, DecorationBuiltIn))
			{
				builtin_to_initializer[builtin] = var.initializer;
			}
		}
	});

	// Emit global variables for the interface variables which are statically used by the shader.
	builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		uint32_t array_size = 0;

		string init_expr;
		auto init_itr = builtin_to_initializer.find(builtin);
		if (init_itr != builtin_to_initializer.end())
			init_expr = join(" = ", to_expression(init_itr->second));

		if (get_execution_model() == ExecutionModelMeshEXT)
		{
			if (builtin == BuiltInPosition || builtin == BuiltInPointSize || builtin == BuiltInClipDistance ||
			    builtin == BuiltInCullDistance || builtin == BuiltInLayer || builtin == BuiltInPrimitiveId ||
			    builtin == BuiltInViewportIndex || builtin == BuiltInCullPrimitiveEXT ||
			    builtin == BuiltInPrimitiveShadingRateKHR || builtin == BuiltInPrimitivePointIndicesEXT ||
			    builtin == BuiltInPrimitiveLineIndicesEXT || builtin == BuiltInPrimitiveTriangleIndicesEXT)
			{
				return;
			}
		}

		switch (builtin)
		{
		case BuiltInFragCoord:
		case BuiltInPosition:
			type = "float4";
			break;

		case BuiltInFragDepth:
			type = "float";
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			type = "int";
			if (hlsl_options.support_nonzero_base_vertex_base_instance || hlsl_options.shader_model >= 68)
				base_vertex_info.used = true;
			break;

		case BuiltInBaseVertex:
		case BuiltInBaseInstance:
			type = "int";
			base_vertex_info.used = true;
			break;

		case BuiltInInstanceId:
		case BuiltInSampleId:
			type = "int";
			break;

		case BuiltInPointSize:
			if (hlsl_options.point_size_compat || hlsl_options.shader_model <= 30)
			{
				// Just emit the global variable, it will be ignored.
				type = "float";
				break;
			}
			else
				SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));

		case BuiltInGlobalInvocationId:
		case BuiltInLocalInvocationId:
		case BuiltInWorkgroupId:
			type = "uint3";
			break;

		case BuiltInLocalInvocationIndex:
			type = "uint";
			break;

		case BuiltInFrontFacing:
			type = "bool";
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
			// Handled specially.
			break;

		case BuiltInSubgroupLocalInvocationId:
		case BuiltInSubgroupSize:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			break;

		case BuiltInSubgroupEqMask:
		case BuiltInSubgroupLtMask:
		case BuiltInSubgroupLeMask:
		case BuiltInSubgroupGtMask:
		case BuiltInSubgroupGeMask:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			type = "uint4";
			break;

		case BuiltInHelperInvocation:
			if (hlsl_options.shader_model < 50)
				SPIRV_CROSS_THROW("Need SM 5.0 for Helper Invocation.");
			break;

		case BuiltInClipDistance:
			array_size = clip_distance_count;
			type = "float";
			break;

		case BuiltInCullDistance:
			array_size = cull_distance_count;
			type = "float";
			break;

		case BuiltInSampleMask:
			if (active_input_builtins.get(BuiltInSampleMask))
				type = sample_mask_in_basetype == SPIRType::UInt ? "uint" : "int";
			else
				type = sample_mask_out_basetype == SPIRType::UInt ? "uint" : "int";
			array_size = 1;
			break;

		case BuiltInPrimitiveId:
		case BuiltInViewIndex:
		case BuiltInLayer:
			type = "uint";
			break;

		case BuiltInViewportIndex:
		case BuiltInPrimitiveShadingRateKHR:
		case BuiltInPrimitiveLineIndicesEXT:
		case BuiltInCullPrimitiveEXT:
			type = "uint";
			break;

		default:
			SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));
		}

		StorageClass storage = active_input_builtins.get(i) ? StorageClassInput : StorageClassOutput;

		if (type)
		{
			if (array_size)
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), "[", array_size, "]", init_expr, ";");
			else
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), init_expr, ";");
		}

		// SampleMask can be both in and out with sample builtin, in this case we have already
		// declared the input variable and we need to add the output one now.
		if (builtin == BuiltInSampleMask && storage == StorageClassInput && this->active_output_builtins.get(i))
		{
			type = sample_mask_out_basetype == SPIRType::UInt ? "uint" : "int";
			if (array_size)
				statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), "[", array_size, "]", init_expr, ";");
			else
				statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), init_expr, ";");
		}
	});

	if (base_vertex_info.used && hlsl_options.shader_model < 68)
	{
		string binding_info;
		if (base_vertex_info.explicit_binding)
		{
			binding_info = join(" : register(b", base_vertex_info.register_index);
			if (base_vertex_info.register_space)
				binding_info += join(", space", base_vertex_info.register_space);
			binding_info += ")";
		}
		statement("cbuffer SPIRV_Cross_VertexInfo", binding_info);
		begin_scope();
		statement("int SPIRV_Cross_BaseVertex;");
		statement("int SPIRV_Cross_BaseInstance;");
		end_scope_decl();
		statement("");
	}
}